

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O0

SymbolTableRes * constructSymbolTable(SymbolTableRes *__return_storage_ptr__,CProgram *program)

{
  vector<CError,_std::allocator<CError>_> local_90;
  undefined1 local_78 [40];
  CConstructSymbolTableVisitor symbol_table_visitor;
  CProgram *program_local;
  SymbolTableRes *res;
  
  symbol_table_visitor.errors.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)program;
  CConstructSymbolTableVisitor::CConstructSymbolTableVisitor
            ((CConstructSymbolTableVisitor *)(local_78 + 0x20));
  (*(code *)**(undefined8 **)
              symbol_table_visitor.errors.super__Vector_base<CError,_std::allocator<CError>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)
            (symbol_table_visitor.errors.super__Vector_base<CError,_std::allocator<CError>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,
             (CConstructSymbolTableVisitor *)(local_78 + 0x20));
  local_78[0x13] = 0;
  SymbolTableRes::SymbolTableRes(__return_storage_ptr__);
  CConstructSymbolTableVisitor::GetSymbolTable((CConstructSymbolTableVisitor *)local_78);
  std::shared_ptr<SymbolTable>::operator=
            (&__return_storage_ptr__->symbolTable,(shared_ptr<SymbolTable> *)local_78);
  std::shared_ptr<SymbolTable>::~shared_ptr((shared_ptr<SymbolTable> *)local_78);
  CConstructSymbolTableVisitor::GetErrors
            (&local_90,(CConstructSymbolTableVisitor *)(local_78 + 0x20));
  std::vector<CError,_std::allocator<CError>_>::operator=(&__return_storage_ptr__->errors,&local_90)
  ;
  std::vector<CError,_std::allocator<CError>_>::~vector(&local_90);
  local_78[0x13] = 1;
  CConstructSymbolTableVisitor::~CConstructSymbolTableVisitor
            ((CConstructSymbolTableVisitor *)(local_78 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

SymbolTableRes constructSymbolTable( CProgram *program ) {
    CConstructSymbolTableVisitor symbol_table_visitor = CConstructSymbolTableVisitor( );
    program->Accept( symbol_table_visitor );

    SymbolTableRes res;
    res.symbolTable = symbol_table_visitor.GetSymbolTable( );
    res.errors = symbol_table_visitor.GetErrors( );

    return res;
}